

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_crop.cpp
# Opt level: O3

int test_crop(Mat *a,int woffset,int hoffset,int coffset,int outw,int outh,int outc,int woffset2,
             int hoffset2,int coffset2)

{
  int *piVar1;
  void *__ptr;
  long *plVar2;
  int iVar3;
  undefined4 in_register_00000014;
  long lVar4;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> local_978;
  Option opt;
  ParamDict pd;
  
  ncnn::ParamDict::ParamDict(&pd);
  ncnn::ParamDict::set(&pd,0,woffset);
  ncnn::ParamDict::set(&pd,1,hoffset);
  ncnn::ParamDict::set(&pd,2,coffset);
  ncnn::ParamDict::set(&pd,3,outw);
  ncnn::ParamDict::set(&pd,4,outh);
  ncnn::ParamDict::set(&pd,5,outc);
  ncnn::ParamDict::set(&pd,6,woffset2);
  ncnn::ParamDict::set(&pd,7,hoffset2);
  ncnn::ParamDict::set(&pd,8,coffset2);
  local_978.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_978.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_978.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ncnn::Option::Option(&opt);
  opt.num_threads = 1;
  opt.use_int8_inference = false;
  opt.use_vulkan_compute = true;
  iVar3 = test_layer<ncnn::Crop>("Crop",&pd,&local_978,&opt,a,0.001,(_func_void_Crop_ptr *)0x0);
  if (iVar3 != 0) {
    fprintf(_stderr,
            "test_crop failed a.dims=%d a=(%d %d %d) woffset=%d hoffset=%d coffset=%d outw=%d outh=%d outc=%d woffset2=%d hoffset2=%d coffset2=%d\n"
            ,(ulong)(uint)a->dims,(ulong)(uint)a->w,(ulong)(uint)a->h,(ulong)(uint)a->c,
            (ulong)(uint)woffset,CONCAT44(in_register_00000014,hoffset),(ulong)(uint)coffset,
            (ulong)(uint)outw,(ulong)(uint)outh,(ulong)(uint)outc,(ulong)(uint)woffset2,
            (ulong)(uint)hoffset2,(ulong)(uint)coffset2);
  }
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&local_978);
  lVar4 = 0x8c0;
  do {
    piVar1 = *(int **)((long)&pd.params[0].v.data + lVar4);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        __ptr = *(void **)((long)&pd.params[0].type + lVar4);
        plVar2 = *(long **)((long)&pd.params[0].v.elempack + lVar4);
        if (plVar2 == (long *)0x0) {
          if (__ptr != (void *)0x0) {
            free(__ptr);
          }
        }
        else {
          (**(code **)(*plVar2 + 0x18))();
        }
      }
    }
    *(undefined8 *)((long)&pd.params[0].v.data + lVar4 + 4) = 0;
    *(undefined8 *)((long)&pd.params[0].v.refcount + lVar4 + 4) = 0;
    *(undefined8 *)((long)&pd.params[0].type + lVar4) = 0;
    *(undefined8 *)((long)&pd.params[0].v.data + lVar4) = 0;
    *(undefined8 *)((long)&pd.params[0].v.allocator + lVar4) = 0;
    *(undefined8 *)((long)&pd.params[0].v.dims + lVar4) = 0;
    *(undefined8 *)((long)&pd.params[0].v.h + lVar4) = 0;
    lVar4 = lVar4 + -0x48;
  } while (lVar4 != -0x40);
  return iVar3;
}

Assistant:

static int test_crop(const ncnn::Mat& a, int woffset, int hoffset, int coffset, int outw, int outh, int outc, int woffset2, int hoffset2, int coffset2)
{
    ncnn::ParamDict pd;
    pd.set(0, woffset);// woffset
    pd.set(1, hoffset);// hoffset
    pd.set(2, coffset);// coffset
    pd.set(3, outw);// outw
    pd.set(4, outh);// outh
    pd.set(5, outc);// outc
    pd.set(6, woffset2);// woffset2
    pd.set(7, hoffset2);// hoffset2
    pd.set(8, coffset2);// coffset2

    std::vector<ncnn::Mat> weights(0);

    ncnn::Option opt;
    opt.num_threads = 1;
    opt.use_vulkan_compute = true;
    opt.use_int8_inference = false;

    int ret = test_layer<ncnn::Crop>("Crop", pd, weights, opt, a);
    if (ret != 0)
    {
        fprintf(stderr, "test_crop failed a.dims=%d a=(%d %d %d) woffset=%d hoffset=%d coffset=%d outw=%d outh=%d outc=%d woffset2=%d hoffset2=%d coffset2=%d\n", a.dims, a.w, a.h, a.c, woffset, hoffset, coffset, outw, outh, outc, woffset2, hoffset2, coffset2);
    }

    return ret;
}